

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_transferencode(Curl_easy *data)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar1 = Curl_checkheaders(data,"TE",2);
  if ((pcVar1 == (char *)0x0) && (((data->set).field_0x8bc & 0x40) != 0)) {
    pcVar1 = Curl_checkheaders(data,"Connection",10);
    (*Curl_cfree)((data->state).aptr.te);
    (data->state).aptr.te = (char *)0x0;
    if (pcVar1 == (char *)0x0) {
      pcVar2 = "";
      pcVar3 = "";
      pcVar1 = (char *)0x0;
    }
    else {
      pcVar2 = Curl_copy_header_value(pcVar1);
      if (pcVar2 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar3 = ", ";
      pcVar1 = pcVar2;
      if (*pcVar2 == '\0') {
        pcVar3 = "";
      }
    }
    pcVar2 = curl_maprintf("Connection: %s%sTE\r\nTE: gzip\r\n",pcVar2,pcVar3);
    (data->state).aptr.te = pcVar2;
    (*Curl_cfree)(pcVar1);
    if ((data->state).aptr.te == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_transferencode(struct Curl_easy *data)
{
  if(!Curl_checkheaders(data, STRCONST("TE")) &&
     data->set.http_transfer_encoding) {
    /* When we are to insert a TE: header in the request, we must also insert
       TE in a Connection: header, so we need to merge the custom provided
       Connection: header and prevent the original to get sent. Note that if
       the user has inserted his/her own TE: header we don't do this magic
       but then assume that the user will handle it all! */
    char *cptr = Curl_checkheaders(data, STRCONST("Connection"));
#define TE_HEADER "TE: gzip\r\n"

    Curl_safefree(data->state.aptr.te);

    if(cptr) {
      cptr = Curl_copy_header_value(cptr);
      if(!cptr)
        return CURLE_OUT_OF_MEMORY;
    }

    /* Create the (updated) Connection: header */
    data->state.aptr.te = aprintf("Connection: %s%sTE\r\n" TE_HEADER,
                                cptr ? cptr : "", (cptr && *cptr) ? ", ":"");

    free(cptr);
    if(!data->state.aptr.te)
      return CURLE_OUT_OF_MEMORY;
  }
  return CURLE_OK;
}